

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O1

void __thiscall glslang::TArraySizes::copyDereferenced(TArraySizes *this,TArraySizes *rhs)

{
  TVector<glslang::TArraySize> *pTVar1;
  vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>> *pvVar2;
  
  pTVar1 = (this->sizes).sizes;
  if ((pTVar1 != (TVector<glslang::TArraySize> *)0x0) &&
     ((int)((ulong)((long)(pTVar1->
                          super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                          ).
                          super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pTVar1->
                         super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                         ).
                         super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) != 0)) {
    __assert_fail("sizes.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/arrays.h"
                  ,0x141,"void glslang::TArraySizes::copyDereferenced(const TArraySizes &)");
  }
  pTVar1 = (rhs->sizes).sizes;
  if ((pTVar1 != (TVector<glslang::TArraySize> *)0x0) &&
     (1 < (int)((ulong)((long)(pTVar1->
                              super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                              ).
                              super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar1->
                             super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                             ).
                             super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
    if ((this->sizes).sizes != (TVector<glslang::TArraySize> *)0x0) {
      __assert_fail("sizes == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/arrays.h"
                    ,0xa5,"void glslang::TSmallArrayVector::copyNonFront(const TSmallArrayVector &)"
                   );
    }
    pTVar1 = (rhs->sizes).sizes;
    if ((pTVar1 != (TVector<glslang::TArraySize> *)0x0) &&
       (1 < (int)((ulong)((long)(pTVar1->
                                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ).
                                super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar1->
                               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ).
                               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
      TSmallArrayVector::alloc(&this->sizes);
      pvVar2 = (vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>> *)
               (this->sizes).sizes;
      pTVar1 = (rhs->sizes).sizes;
      std::vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<glslang::TArraySize*,std::vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>>>>
                (pvVar2,*(undefined8 *)(pvVar2 + 8),
                 (pTVar1->
                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1,
                 (pTVar1->
                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      return;
    }
    return;
  }
  return;
}

Assistant:

int size() const
    {
        if (sizes == nullptr)
            return 0;
        return (int)sizes->size();
    }